

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O2

int tbx_parse1(tbx_conf_t *conf,int len,char *line,tbx_intv_t *intv)

{
  char cVar1;
  short sVar2;
  long lVar3;
  __int32_t **pp_Var4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  char *local_60;
  tbx_intv_t *local_58;
  tbx_conf_t *local_50;
  char *local_48;
  char **local_40;
  char *t;
  
  local_40 = &intv->ss;
  intv->ss = (char *)0x0;
  intv->se = (char *)0x0;
  *(undefined4 *)&intv->beg = 0xffffffff;
  *(undefined4 *)((long)&intv->beg + 4) = 0xffffffff;
  *(undefined4 *)&intv->end = 0xffffffff;
  *(undefined4 *)((long)&intv->end + 4) = 0xffffffff;
  lVar9 = 0;
  iVar8 = 1;
  iVar11 = 0;
  local_58 = intv;
  local_50 = conf;
  do {
    while( true ) {
      iVar10 = -1;
      if (len < lVar9) {
        if (((*local_40 != (char *)0x0) && (intv->se != (char *)0x0)) && (-1 < intv->beg)) {
          iVar10 = (int)(intv->end >> 0x3f);
        }
        return iVar10;
      }
      cVar1 = line[lVar9];
      if ((cVar1 == '\0') || (cVar1 == '\t')) break;
      lVar9 = lVar9 + 1;
    }
    pcVar7 = line + lVar9;
    lVar6 = (long)iVar11;
    if (iVar8 == conf->sc) {
      intv->ss = line + lVar6;
      intv->se = pcVar7;
    }
    else if (iVar8 == conf->bc) {
      lVar3 = strtol(line + lVar6,&local_60,0);
      local_58->end = lVar3;
      local_58->beg = lVar3;
      if (local_60 == line + lVar6) {
        return -1;
      }
      if ((local_50->preset & 0x10000) == 0) {
        local_58->beg = lVar3 + -1;
        lVar6 = lVar3 + -1;
        lVar5 = lVar3;
      }
      else {
        lVar5 = lVar3 + 1;
        local_58->end = lVar5;
        lVar6 = lVar3;
      }
      if (lVar6 < 0) {
        local_58->beg = 0;
      }
      intv = local_58;
      conf = local_50;
      if (lVar5 < 1) {
        local_58->end = 1;
      }
    }
    else {
      sVar2 = (short)conf->preset;
      local_48 = pcVar7;
      if (sVar2 == 2) {
        if (iVar8 == 8) {
          *pcVar7 = '\0';
          pcVar7 = line + lVar6;
          local_60 = strstr(pcVar7,"END=");
          if (local_60 == pcVar7) {
            local_60 = local_60 + 4;
LAB_0012c8b9:
            lVar6 = strtol(local_60,&local_60,0);
            local_58->end = lVar6;
          }
          else if ((local_60 != (char *)0x0) &&
                  (local_60 = strstr(pcVar7,";END="), local_60 != (char *)0x0)) {
            local_60 = local_60 + 5;
            goto LAB_0012c8b9;
          }
          *local_48 = cVar1;
          intv = local_58;
          conf = local_50;
        }
        else if ((iVar8 == 4) && (lVar6 < lVar9)) {
          intv->end = (long)((int)lVar9 - iVar11) + intv->beg;
        }
      }
      else if (sVar2 == 1) {
        if (iVar8 == 6) {
          iVar11 = 0;
          pcVar7 = line + lVar6;
          while (pcVar7 < local_48) {
            lVar6 = strtol(pcVar7,&t,10);
            pp_Var4 = __ctype_toupper_loc();
            if (((*pp_Var4)[*t] - 0x44U < 0xb) &&
               ((0x601U >> ((*pp_Var4)[*t] - 0x44U & 0x1f) & 1) != 0)) {
              iVar11 = iVar11 + (int)lVar6;
            }
            intv = local_58;
            conf = local_50;
            pcVar7 = t + 1;
          }
          intv->end = (long)(int)(iVar11 + (uint)(iVar11 == 0)) + intv->beg;
          local_60 = pcVar7;
        }
      }
      else if ((sVar2 == 0) && (iVar8 == conf->ec)) {
        lVar3 = strtol(line + lVar6,&local_60,0);
        local_58->end = lVar3;
        intv = local_58;
        conf = local_50;
        if (local_60 == line + lVar6) {
          return -1;
        }
      }
    }
    lVar9 = lVar9 + 1;
    iVar8 = iVar8 + 1;
    iVar11 = (int)lVar9;
  } while( true );
}

Assistant:

int tbx_parse1(const tbx_conf_t *conf, int len, char *line, tbx_intv_t *intv)
{
    int i, b = 0, id = 1, ncols = 0;
    char *s;
    intv->ss = intv->se = 0; intv->beg = intv->end = -1;
    for (i = 0; i <= len; ++i) {
        if (line[i] == '\t' || line[i] == 0) {
            ++ncols;
            if (id == conf->sc) {
                intv->ss = line + b; intv->se = line + i;
            } else if (id == conf->bc) {
                // here ->beg is 0-based.
                intv->beg = intv->end = strtol(line + b, &s, 0);
                if ( s==line+b ) return -1; // expected int
                if (!(conf->preset&TBX_UCSC)) --intv->beg;
                else ++intv->end;
                if (intv->beg < 0) intv->beg = 0;
                if (intv->end < 1) intv->end = 1;
            } else {
                if ((conf->preset&0xffff) == TBX_GENERIC) {
                    if (id == conf->ec)
                    {
                        intv->end = strtol(line + b, &s, 0);
                        if ( s==line+b ) return -1; // expected int
                    }
                } else if ((conf->preset&0xffff) == TBX_SAM) {
                    if (id == 6) { // CIGAR
                        int l = 0, op;
                        char *t;
                        for (s = line + b; s < line + i;) {
                            long x = strtol(s, &t, 10);
                            op = toupper(*t);
                            if (op == 'M' || op == 'D' || op == 'N') l += x;
                            s = t + 1;
                        }
                        if (l == 0) l = 1;
                        intv->end = intv->beg + l;
                    }
                } else if ((conf->preset&0xffff) == TBX_VCF) {
                    if (id == 4) {
                        if (b < i) intv->end = intv->beg + (i - b);
                    } else if (id == 8) { // look for "END="
                        int c = line[i];
                        line[i] = 0;
                        s = strstr(line + b, "END=");
                        if (s == line + b) s += 4;
                        else if (s) {
                            s = strstr(line + b, ";END=");
                            if (s) s += 5;
                        }
                        if (s) intv->end = strtol(s, &s, 0);
                        line[i] = c;
                    }
                }
            }
            b = i + 1;
            ++id;
        }
    }
    if (intv->ss == 0 || intv->se == 0 || intv->beg < 0 || intv->end < 0) return -1;
    return 0;
}